

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O0

void __thiscall xray_re::xr_ogf_v3::load_hierrarhy_visual(xr_ogf_v3 *this,xr_reader *r)

{
  size_t sVar1;
  xr_reader *local_20;
  xr_reader *s;
  xr_reader *r_local;
  xr_ogf_v3 *this_local;
  
  s = r;
  r_local = (xr_reader *)this;
  load_render_visual(this,r);
  sVar1 = xr_reader::find_chunk(s,0xc);
  if (sVar1 == 0) {
    local_20 = xr_reader::open_chunk(s,0x11);
    if (local_20 == (xr_reader *)0x0) {
      sVar1 = xr_reader::find_chunk(s,5);
      if (sVar1 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                      ,0x35a,"void xray_re::xr_ogf_v3::load_hierrarhy_visual(xr_reader &)");
      }
      load_child_refs(this,s);
      xr_reader::debug_find_chunk(s);
    }
    else {
      load_children(this,local_20);
      xr_reader::close_chunk(s,&local_20);
    }
  }
  else {
    load_children_l(this,s);
    xr_reader::debug_find_chunk(s);
  }
  return;
}

Assistant:

void xr_ogf_v3::load_hierrarhy_visual(xr_reader& r)
{
	load_render_visual(r);
	if (r.find_chunk(OGF3_CHILDREN_L)) {
		load_children_l(r);
		r.debug_find_chunk();
	} else {
		xr_reader* s = r.open_chunk(OGF3_CHILDREN);
		if (s) {
			load_children(*s);
			r.close_chunk(s);
		} else {
			if (!r.find_chunk(OGF3_CHILD_REFS))
				xr_not_expected();
			load_child_refs(r);
			r.debug_find_chunk();
		}
	}
}